

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGGrindReader.cpp
# Opt level: O2

void __thiscall CFGGrindReader::matchToken(CFGGrindReader *this,Type type)

{
  Lexeme LStack_48;
  
  if ((this->m_current).type == type) {
    InputTokenizer::nextToken(&LStack_48,&this->m_tokens);
    InputTokenizer::Lexeme::operator=(&this->m_current,&LStack_48);
    InputTokenizer::Lexeme::~Lexeme(&LStack_48);
    return;
  }
  __assert_fail("m_current.type == type",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGGrindReader.cpp"
                ,0xd0,"void CFGGrindReader::matchToken(InputTokenizer::Lexeme::Type)");
}

Assistant:

void CFGGrindReader::matchToken(InputTokenizer::Lexeme::Type type) {
	assert(m_current.type == type);
	m_current = m_tokens.nextToken();
}